

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O3

Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *pFForm,Mvc_Cover_t *pCover)

{
  int iVar1;
  Vec_Int_t *p;
  Vec_Int_t *vEdgeLits;
  int iVar2;
  Dec_Edge_t DVar3;
  Dec_Edge_t DVar4;
  Mvc_Cover_t *pMVar5;
  void *pvVar6;
  Dec_Node_t *pDVar7;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pQuo;
  Mvc_Cover_t *pRem;
  Mvc_Cover_t *pDiv;
  Mvc_Cover_t *local_48;
  Mvc_Cover_t *local_40;
  Mvc_Cover_t *local_38;
  
  iVar2 = Mvc_CoverReadCubeNum(pCover);
  if (iVar2 == 0) {
    __assert_fail("Mvc_CoverReadCubeNum(pCover)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/dec/decFactor.c"
                  ,0x73,"Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *, Mvc_Cover_t *)");
  }
  pMVar5 = Mvc_CoverDivisor(pCover);
  local_38 = pMVar5;
  if (pMVar5 != (Mvc_Cover_t *)0x0) {
    Mvc_CoverDivideInternal(pCover,pMVar5,&local_48,&local_40);
    iVar2 = Mvc_CoverReadCubeNum(local_48);
    if (iVar2 == 0) {
      __assert_fail("Mvc_CoverReadCubeNum(pQuo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/dec/decFactor.c"
                    ,0x7c,"Dec_Edge_t Dec_Factor_rec(Dec_Graph_t *, Mvc_Cover_t *)");
    }
    Mvc_CoverFree(pMVar5);
    Mvc_CoverFree(local_40);
    iVar2 = Mvc_CoverReadCubeNum(local_48);
    if (iVar2 == 1) {
      DVar3 = Dec_FactorLF_rec(pFForm,pCover,local_48);
      pMVar5 = local_48;
    }
    else {
      Mvc_CoverMakeCubeFree(local_48);
      Mvc_CoverDivideInternal(pCover,local_48,&local_38,&local_40);
      iVar2 = Mvc_CoverIsCubeFree(local_38);
      if (iVar2 == 0) {
        pMVar5 = Mvc_CoverCommonCubeCover(local_38);
        Mvc_CoverFree(local_38);
        Mvc_CoverFree(local_48);
        Mvc_CoverFree(local_40);
        DVar3 = Dec_FactorLF_rec(pFForm,pCover,pMVar5);
      }
      else {
        DVar3 = Dec_Factor_rec(pFForm,local_38);
        DVar4 = Dec_Factor_rec(pFForm,local_48);
        Mvc_CoverFree(local_38);
        Mvc_CoverFree(local_48);
        iVar2 = pFForm->nSize;
        pDVar7 = pFForm->pNodes;
        if (iVar2 == pFForm->nCap) {
          if (pDVar7 == (Dec_Node_t *)0x0) {
            pDVar7 = (Dec_Node_t *)malloc((long)iVar2 * 0x30);
            iVar1 = iVar2;
          }
          else {
            pDVar7 = (Dec_Node_t *)realloc(pDVar7,(long)iVar2 * 0x30);
            iVar2 = pFForm->nSize;
            iVar1 = pFForm->nCap;
          }
          pFForm->pNodes = pDVar7;
          pFForm->nCap = iVar1 * 2;
        }
        pFForm->nSize = iVar2 + 1;
        pDVar7[iVar2].field_2.pFunc = (void *)0x0;
        (&pDVar7[iVar2].field_2)[1].pFunc = (void *)0x0;
        pDVar7[iVar2].eEdge0 = DVar3;
        pDVar7[iVar2].eEdge1 = DVar4;
        *(uint *)&pDVar7[iVar2].field_0x10 = ((uint)DVar4 & 1) << 0x10 | ((uint)DVar3 & 1) << 0xf;
        DVar3 = (Dec_Edge_t)(pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe);
        iVar2 = Mvc_CoverReadCubeNum(local_40);
        pMVar5 = local_40;
        if (iVar2 != 0) {
          DVar4 = Dec_Factor_rec(pFForm,local_40);
          Mvc_CoverFree(local_40);
          iVar2 = pFForm->nSize;
          pDVar7 = pFForm->pNodes;
          if (iVar2 == pFForm->nCap) {
            if (pDVar7 == (Dec_Node_t *)0x0) {
              pDVar7 = (Dec_Node_t *)malloc((long)iVar2 * 0x30);
              iVar1 = iVar2;
            }
            else {
              pDVar7 = (Dec_Node_t *)realloc(pDVar7,(long)iVar2 * 0x30);
              iVar2 = pFForm->nSize;
              iVar1 = pFForm->nCap;
            }
            pFForm->pNodes = pDVar7;
            pFForm->nCap = iVar1 * 2;
          }
          pFForm->nSize = iVar2 + 1;
          pDVar7[iVar2].field_2.pFunc = (void *)0x0;
          (&pDVar7[iVar2].field_2)[1].pFunc = (void *)0x0;
          *(uint *)&pDVar7[iVar2].field_0x10 = ((uint)DVar4 & 1) << 0x10 | 0x4000;
          pDVar7[iVar2].eEdge0 = (Dec_Edge_t)((uint)DVar3 | 1);
          pDVar7[iVar2].eEdge1 = (Dec_Edge_t)((uint)DVar4 ^ 1);
          return (Dec_Edge_t)((pFForm->nSize * 2 + 0x7ffffffeU & 0x7ffffffe) + 1);
        }
      }
    }
    Mvc_CoverFree(pMVar5);
    return DVar3;
  }
  iVar2 = 0;
  pvVar6 = Abc_FrameReadManDec();
  p = *(Vec_Int_t **)((long)pvVar6 + 8);
  vEdgeLits = *(Vec_Int_t **)((long)pvVar6 + 0x10);
  p->nSize = 0;
  pCube = (pCover->lCubes).pHead;
  if (pCube != (Mvc_Cube_t *)0x0) {
    do {
      DVar3 = Dec_FactorTrivialCube(pFForm,pCover,pCube,vEdgeLits);
      Vec_IntPush(p,(int)DVar3);
      pCube = pCube->pNext;
    } while (pCube != (Mvc_Cube_t *)0x0);
    iVar2 = p->nSize;
  }
  DVar3 = Dec_FactorTrivialTree_rec(pFForm,(Dec_Edge_t *)p->pArray,iVar2,1);
  return DVar3;
}

Assistant:

Dec_Edge_t Dec_Factor_rec( Dec_Graph_t * pFForm, Mvc_Cover_t * pCover )
{
    Mvc_Cover_t * pDiv, * pQuo, * pRem, * pCom;
    Dec_Edge_t eNodeDiv, eNodeQuo, eNodeRem;
    Dec_Edge_t eNodeAnd, eNode;

    // make sure the cover contains some cubes
    assert( Mvc_CoverReadCubeNum(pCover) );

    // get the divisor
    pDiv = Mvc_CoverDivisor( pCover );
    if ( pDiv == NULL )
        return Dec_FactorTrivial( pFForm, pCover );

    // divide the cover by the divisor
    Mvc_CoverDivideInternal( pCover, pDiv, &pQuo, &pRem );
    assert( Mvc_CoverReadCubeNum(pQuo) );

    Mvc_CoverFree( pDiv );
    Mvc_CoverFree( pRem );

    // check the trivial case
    if ( Mvc_CoverReadCubeNum(pQuo) == 1 )
    {
        eNode = Dec_FactorLF_rec( pFForm, pCover, pQuo );
        Mvc_CoverFree( pQuo );
        return eNode;
    }

    // make the quotient cube ABC_FREE
    Mvc_CoverMakeCubeFree( pQuo );

    // divide the cover by the quotient
    Mvc_CoverDivideInternal( pCover, pQuo, &pDiv, &pRem );

    // check the trivial case
    if ( Mvc_CoverIsCubeFree( pDiv ) )
    {
        eNodeDiv = Dec_Factor_rec( pFForm, pDiv );
        eNodeQuo = Dec_Factor_rec( pFForm, pQuo );
        Mvc_CoverFree( pDiv );
        Mvc_CoverFree( pQuo );
        eNodeAnd = Dec_GraphAddNodeAnd( pFForm, eNodeDiv, eNodeQuo );
        if ( Mvc_CoverReadCubeNum(pRem) == 0 )
        {
            Mvc_CoverFree( pRem );
            return eNodeAnd;
        }
        else
        {
            eNodeRem = Dec_Factor_rec( pFForm, pRem );
            Mvc_CoverFree( pRem );
            return Dec_GraphAddNodeOr( pFForm, eNodeAnd, eNodeRem );
        }
    }

    // get the common cube
    pCom = Mvc_CoverCommonCubeCover( pDiv );
    Mvc_CoverFree( pDiv );
    Mvc_CoverFree( pQuo );
    Mvc_CoverFree( pRem );

    // solve the simple problem
    eNode = Dec_FactorLF_rec( pFForm, pCover, pCom );
    Mvc_CoverFree( pCom );
    return eNode;
}